

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_flip(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  rle16_t *prVar3;
  _Bool _Var4;
  uint8_t uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  roaring_array_t *ra;
  roaring_bitmap_t *prVar9;
  run_container_t *prVar10;
  run_container_t *prVar11;
  uint64_t uVar12;
  long lVar13;
  uint16_t hb;
  ushort uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint8_t uVar19;
  uint16_t lb_start;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  int local_50;
  run_container_t *local_40;
  uint local_34;
  
  if (range_end <= range_start) {
    prVar9 = roaring_bitmap_copy(x1);
    return prVar9;
  }
  uVar12 = 0;
  if (range_end < 0x100000000) {
    uVar12 = range_end;
  }
  ra = &roaring_bitmap_create_with_capacity(0)->high_low_container;
  ra->flags = ra->flags & 0xfe | (x1->high_low_container).flags & 1;
  uVar16 = uVar12 - 1;
  hb = (uint16_t)(uVar16 >> 0x10);
  uVar14 = (ushort)(range_start >> 0x10);
  ra_append_copies_until
            (ra,&x1->high_low_container,uVar14,(_Bool)((x1->high_low_container).flags & 1));
  lb_start = (uint16_t)range_start;
  if (hb == uVar14) {
    insert_flipped_container(ra,&x1->high_low_container,uVar14,lb_start,(uint16_t)uVar16);
  }
  else {
    if (lb_start != 0) {
      insert_flipped_container(ra,&x1->high_low_container,uVar14,lb_start,0xffff);
      uVar14 = uVar14 + 1;
    }
    uVar15 = ((uint)(uVar16 >> 0x10) & 0xffff) - (uint)((uVar16 & 0xffff) != 0xffff);
    hb = (uint16_t)uVar15;
    if (uVar14 <= hb) {
      local_34 = uVar15 & 0xffff;
      uVar15 = (uint)uVar14;
      do {
        iVar8 = (x1->high_low_container).size;
        uVar14 = (ushort)uVar15;
        if (((long)iVar8 == 0) ||
           (puVar2 = (x1->high_low_container).keys, puVar2[(long)iVar8 + -1] == uVar14)) {
          uVar6 = iVar8 - 1;
        }
        else {
          uVar7 = iVar8 - 1;
          uVar18 = 0;
          uVar20 = uVar7;
          do {
            if ((int)uVar7 < (int)uVar18) {
              uVar6 = ~uVar18;
              break;
            }
            uVar6 = uVar18 + uVar7 >> 1;
            uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar18 + uVar7 & 0xfffffffe));
            if (uVar1 < uVar14) {
              uVar18 = uVar6 + 1;
              bVar22 = true;
              uVar6 = uVar20;
            }
            else if (uVar14 < uVar1) {
              uVar7 = uVar6 - 1;
              bVar22 = true;
              uVar6 = uVar20;
            }
            else {
              bVar22 = false;
            }
            uVar20 = uVar6;
          } while (bVar22);
        }
        iVar8 = ra->size;
        if (((long)iVar8 == 0) || (ra->keys[(long)iVar8 + -1] == uVar14)) {
          uVar20 = iVar8 - 1;
        }
        else {
          uVar21 = iVar8 - 1;
          uVar18 = 0;
          uVar7 = uVar21;
          do {
            if ((int)uVar21 < (int)uVar18) {
              uVar20 = ~uVar18;
              break;
            }
            uVar20 = uVar18 + uVar21 >> 1;
            uVar1 = *(ushort *)((long)ra->keys + (ulong)(uVar18 + uVar21 & 0xfffffffe));
            if (uVar1 < uVar14) {
              uVar18 = uVar20 + 1;
              bVar22 = true;
              uVar20 = uVar7;
            }
            else if (uVar14 < uVar1) {
              uVar21 = uVar20 - 1;
              bVar22 = true;
              uVar20 = uVar7;
            }
            else {
              bVar22 = false;
            }
            uVar7 = uVar20;
          } while (bVar22);
        }
        if ((int)uVar6 < 0) {
          prVar10 = run_container_create_given_capacity(1);
          if (prVar10 != (run_container_t *)0x0) {
            prVar3 = prVar10->runs;
            iVar8 = prVar10->n_runs;
            prVar3[iVar8].value = 0;
            prVar3[iVar8].length = 0xffff;
            prVar10->n_runs = iVar8 + 1;
          }
          uVar19 = '\x03';
LAB_0011b8e0:
          ra_insert_new_key_value_at(ra,~uVar20,uVar14,prVar10,uVar19);
        }
        else {
          uVar19 = (x1->high_low_container).typecodes[uVar6 & 0xffff];
          prVar10 = (run_container_t *)(x1->high_low_container).containers[uVar6 & 0xffff];
          if (uVar19 == '\x04') {
            uVar19 = *(uint8_t *)&prVar10->runs;
            if (uVar19 == '\x04') goto LAB_0011b961;
            prVar10 = *(run_container_t **)prVar10;
          }
          local_40 = (run_container_t *)0x0;
          if (uVar19 == '\x03') {
            iVar8 = run_container_negation_range(prVar10,0,0x10000,&local_40);
            uVar19 = (uint8_t)iVar8;
          }
          else if (uVar19 == '\x02') {
            prVar11 = (run_container_t *)bitset_container_create();
            local_40 = prVar11;
            memset(prVar11->runs,0xff,0x2000);
            prVar11->n_runs = 0x10000;
            uVar12 = bitset_clear_list((uint64_t *)prVar11->runs,0x10000,&prVar10->runs->value,
                                       (long)prVar10->n_runs);
            prVar11->n_runs = (int32_t)uVar12;
            uVar19 = '\x01';
          }
          else {
            if (uVar19 != '\x01') {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1824,
                            "container_t *container_not(const container_t *, uint8_t, uint8_t *)");
            }
            _Var4 = bitset_container_negation_range
                              ((bitset_container_t *)prVar10,0,0x10000,&local_40);
            uVar19 = '\x02' - _Var4;
          }
          prVar10 = local_40;
          prVar11 = local_40;
          uVar5 = uVar19;
          if (uVar19 == '\x04') {
            uVar5 = *(uint8_t *)&local_40->runs;
            if (uVar5 == '\x04') {
LAB_0011b961:
              __assert_fail("*type != SHARED_CONTAINER_TYPE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1062,
                            "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                           );
            }
            prVar11 = *(run_container_t **)local_40;
          }
          if (uVar5 == '\x03') {
            lVar13 = cpuid_Extended_Feature_Enumeration_info(7);
            if ((*(uint *)(lVar13 + 4) & 0x20) == 0) {
              iVar8 = prVar11->n_runs;
              lVar13 = (long)iVar8;
              if (0 < lVar13) {
                lVar17 = 0;
                do {
                  iVar8 = iVar8 + (uint)prVar11->runs[lVar17].length;
                  lVar17 = lVar17 + 1;
                } while (lVar13 != lVar17);
              }
            }
            else {
              iVar8 = _avx2_run_container_cardinality(prVar11);
            }
          }
          else {
            if ((uVar5 != '\x02') && (uVar5 != '\x01')) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
            }
            iVar8 = prVar11->n_runs;
          }
          if (iVar8 != 0) goto LAB_0011b8e0;
          container_free(prVar10,uVar19);
        }
        bVar22 = uVar15 != local_34;
        uVar15 = uVar15 + 1;
      } while (bVar22);
    }
    local_50 = (int)(uVar16 & 0xffff);
    if (local_50 != 0xffff) {
      hb = hb + 1;
      insert_flipped_container(ra,&x1->high_low_container,hb,0,(uint16_t)uVar16);
    }
  }
  ra_append_copies_after(ra,&x1->high_low_container,hb,(_Bool)((x1->high_low_container).flags & 1));
  return (roaring_bitmap_t *)ra;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_flip(const roaring_bitmap_t *x1,
                                      uint64_t range_start,
                                      uint64_t range_end) {
    if (range_start >= range_end) {
        return roaring_bitmap_copy(x1);
    }
    if(range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, is_cow(x1));

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;  // & 0xFFFF;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);  // & 0xFFFF;

    ra_append_copies_until(&ans->high_low_container, &x1->high_low_container,
                           hb_start, is_cow(x1));
    if (hb_start == hb_end) {
        insert_flipped_container(&ans->high_low_container,
                                 &x1->high_low_container, hb_start, lb_start,
                                 lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_start,
                                     lb_start, 0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;  // later we'll handle the partial block

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            insert_fully_flipped_container(&ans->high_low_container,
                                           &x1->high_low_container, hb);
        }

        // handle a partial final container
        if (lb_end != 0xFFFF) {
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_end + 1, 0,
                                     lb_end);
            ++hb_end;
        }
    }
    ra_append_copies_after(&ans->high_low_container, &x1->high_low_container,
                           hb_end, is_cow(x1));
    return ans;
}